

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O2

void __thiscall TPZMHMeshControl::InsertPeriferalMaterialObjects(TPZMHMeshControl *this)

{
  int nstate;
  int dimension;
  code *pcVar1;
  TPZMaterial *pTVar2;
  TPZNullMaterial<double> *pTVar3;
  TPZLagrangeMultiplier<double> *this_00;
  TPZLagrangeMultiplier<double> *this_01;
  undefined8 uVar4;
  double local_1a0;
  TPZFNMatrix<4,_double> val2Flux;
  TPZFNMatrix<4,_double> val1;
  
  pTVar2 = TPZCompMesh::FindMaterial
                     (((this->fCMesh).fRef)->fPointer,
                      (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1].
                      _M_color);
  if (pTVar2 == (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x64a);
  }
  val2Flux.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)0x0;
  TPZFNMatrix<4,_double>::TPZFNMatrix
            (&val1,(long)this->fNState,(long)this->fNState,(double *)&val2Flux);
  local_1a0 = 0.0;
  TPZFNMatrix<4,_double>::TPZFNMatrix(&val2Flux,(long)this->fNState,1,&local_1a0);
  pTVar2 = TPZCompMesh::FindMaterial(((this->fCMesh).fRef)->fPointer,this->fSkeletonMatId);
  if (pTVar2 != (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x651);
  }
  pTVar3 = (TPZNullMaterial<double> *)operator_new(0x50);
  TPZNullMaterial<double>::TPZNullMaterial(pTVar3,this->fSkeletonMatId);
  TPZCompMesh::InsertMaterialObject(((this->fCMesh).fRef)->fPointer,(TPZMaterial *)pTVar3);
  pTVar2 = TPZCompMesh::FindMaterial(((this->fCMesh).fRef)->fPointer,this->fPressureSkeletonMatId);
  if (pTVar2 != (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x658);
  }
  pTVar3 = (TPZNullMaterial<double> *)operator_new(0x50);
  TPZNullMaterial<double>::TPZNullMaterial(pTVar3,this->fPressureSkeletonMatId);
  TPZCompMesh::InsertMaterialObject(((this->fCMesh).fRef)->fPointer,(TPZMaterial *)pTVar3);
  pTVar2 = TPZCompMesh::FindMaterial(((this->fCMesh).fRef)->fPointer,this->fSecondSkeletonMatId);
  if (pTVar2 != (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x65e);
  }
  pTVar3 = (TPZNullMaterial<double> *)operator_new(0x50);
  TPZNullMaterial<double>::TPZNullMaterial(pTVar3,this->fSecondSkeletonMatId);
  TPZCompMesh::InsertMaterialObject(((this->fCMesh).fRef)->fPointer,(TPZMaterial *)pTVar3);
  nstate = this->fNState;
  dimension = ((this->fGMesh).fRef)->fPointer->fDim;
  pTVar2 = TPZCompMesh::FindMaterial(((this->fCMesh).fRef)->fPointer,this->fLagrangeMatIdLeft);
  if (pTVar2 != (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x66b);
  }
  pTVar2 = TPZCompMesh::FindMaterial(((this->fCMesh).fRef)->fPointer,this->fLagrangeMatIdRight);
  if (pTVar2 != (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x66e);
  }
  this_00 = (TPZLagrangeMultiplier<double> *)operator_new(0x68);
  TPZLagrangeMultiplier<double>::TPZLagrangeMultiplier
            (this_00,this->fLagrangeMatIdLeft,dimension,nstate);
  this_01 = (TPZLagrangeMultiplier<double> *)operator_new(0x68);
  TPZLagrangeMultiplier<double>::TPZLagrangeMultiplier
            (this_01,this->fLagrangeMatIdRight,dimension,nstate);
  pcVar1 = *(code **)(*(long *)&(this_00->
                                super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
                                ).super_TPZMaterialT<double>.super_TPZMaterial + 200);
  if (this->fSwitchLagrangeSign == true) {
    (*pcVar1)(0xbff0000000000000,this_00);
    uVar4 = 0x3ff0000000000000;
  }
  else {
    (*pcVar1)(0x3ff0000000000000,this_00);
    uVar4 = 0xbff0000000000000;
  }
  (**(code **)(*(long *)&(this_01->
                         super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
                         ).super_TPZMaterialT<double>.super_TPZMaterial + 200))(uVar4,this_01);
  TPZCompMesh::InsertMaterialObject(((this->fCMesh).fRef)->fPointer,(TPZMaterial *)this_00);
  TPZCompMesh::InsertMaterialObject(((this->fCMesh).fRef)->fPointer,(TPZMaterial *)this_01);
  TPZFNMatrix<4,_double>::~TPZFNMatrix(&val2Flux);
  TPZFNMatrix<4,_double>::~TPZFNMatrix(&val1);
  return;
}

Assistant:

void TPZMHMeshControl::InsertPeriferalMaterialObjects()
{
    int matid = *fMaterialIds.begin();
    TPZMaterial *mat = fCMesh->FindMaterial(matid);
    if (!mat) {
        DebugStop();
    }

    TPZFNMatrix<4,STATE> val1(fNState,fNState,0.), val2Flux(fNState,1,0.);
    TPZMaterial *matPerif = nullptr;

    if (fCMesh->FindMaterial(fSkeletonMatId)) {
        DebugStop();
    }
    matPerif = new TPZNullMaterial<STATE>(fSkeletonMatId);
    fCMesh->InsertMaterialObject(matPerif);

    if (1) {
        if (fCMesh->FindMaterial(fPressureSkeletonMatId)) {
            DebugStop();
        }
        matPerif = new TPZNullMaterial<STATE>(fPressureSkeletonMatId);
        fCMesh->InsertMaterialObject(matPerif);

        if (fCMesh->FindMaterial(fSecondSkeletonMatId)) {
            DebugStop();
        }
        matPerif = new TPZNullMaterial<STATE>(fSecondSkeletonMatId);

        fCMesh->InsertMaterialObject(matPerif);


        int LagrangeMatIdLeft = 50;
        int LagrangeMatIdRight = 51;
        int nstate = fNState;
        int dim = fGMesh->Dimension();

        if (fCMesh->FindMaterial(fLagrangeMatIdLeft)) {
            DebugStop();
        }
        if (fCMesh->FindMaterial(fLagrangeMatIdRight)) {
            DebugStop();
        }
        auto *matleft = new TPZLagrangeMultiplier<STATE>(fLagrangeMatIdLeft,dim,nstate);
        auto *matright = new TPZLagrangeMultiplier<STATE>(fLagrangeMatIdRight,dim,nstate);
        if (fSwitchLagrangeSign) {
            matleft->SetMultiplier(-1.);
            matright->SetMultiplier(1.);
        }
        else
        {
            matleft->SetMultiplier(1.);
            matright->SetMultiplier(-1.);
        }
        fCMesh->InsertMaterialObject(matleft);
        fCMesh->InsertMaterialObject(matright);
    }

}